

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmConditionEvaluator.cxx
# Opt level: O0

bool __thiscall
cmConditionEvaluator::IsTrue
          (cmConditionEvaluator *this,
          vector<cmExpandedCommandArgument,_std::allocator<cmExpandedCommandArgument>_> *args,
          string *errorString,MessageType *status)

{
  bool bVar1;
  size_type sVar2;
  reference newArg;
  allocator<cmExpandedCommandArgument> local_59;
  __normal_iterator<const_cmExpandedCommandArgument_*,_std::vector<cmExpandedCommandArgument,_std::allocator<cmExpandedCommandArgument>_>_>
  local_58;
  __normal_iterator<const_cmExpandedCommandArgument_*,_std::vector<cmExpandedCommandArgument,_std::allocator<cmExpandedCommandArgument>_>_>
  local_50;
  undefined1 local_48 [8];
  cmArgumentList newArgs;
  MessageType *status_local;
  string *errorString_local;
  vector<cmExpandedCommandArgument,_std::allocator<cmExpandedCommandArgument>_> *args_local;
  cmConditionEvaluator *this_local;
  
  newArgs.super__List_base<cmExpandedCommandArgument,_std::allocator<cmExpandedCommandArgument>_>.
  _M_impl._M_node._M_size = (size_t)status;
  std::__cxx11::string::clear();
  bVar1 = std::vector<cmExpandedCommandArgument,_std::allocator<cmExpandedCommandArgument>_>::empty
                    (args);
  if (bVar1) {
    this_local._7_1_ = false;
  }
  else {
    local_50._M_current =
         (cmExpandedCommandArgument *)
         std::vector<cmExpandedCommandArgument,_std::allocator<cmExpandedCommandArgument>_>::begin
                   (args);
    local_58._M_current =
         (cmExpandedCommandArgument *)
         std::vector<cmExpandedCommandArgument,_std::allocator<cmExpandedCommandArgument>_>::end
                   (args);
    std::allocator<cmExpandedCommandArgument>::allocator(&local_59);
    std::__cxx11::list<cmExpandedCommandArgument,std::allocator<cmExpandedCommandArgument>>::
    list<__gnu_cxx::__normal_iterator<cmExpandedCommandArgument_const*,std::vector<cmExpandedCommandArgument,std::allocator<cmExpandedCommandArgument>>>,void>
              ((list<cmExpandedCommandArgument,std::allocator<cmExpandedCommandArgument>> *)local_48
               ,local_50,local_58,&local_59);
    std::allocator<cmExpandedCommandArgument>::~allocator(&local_59);
    bVar1 = HandleLevel0(this,(cmArgumentList *)local_48,errorString,
                         (MessageType *)
                         newArgs.
                         super__List_base<cmExpandedCommandArgument,_std::allocator<cmExpandedCommandArgument>_>
                         ._M_impl._M_node._M_size);
    if (bVar1) {
      bVar1 = HandleLevel1(this,(cmArgumentList *)local_48,errorString,
                           (MessageType *)
                           newArgs.
                           super__List_base<cmExpandedCommandArgument,_std::allocator<cmExpandedCommandArgument>_>
                           ._M_impl._M_node._M_size);
      if (bVar1) {
        bVar1 = HandleLevel2(this,(cmArgumentList *)local_48,errorString,
                             (MessageType *)
                             newArgs.
                             super__List_base<cmExpandedCommandArgument,_std::allocator<cmExpandedCommandArgument>_>
                             ._M_impl._M_node._M_size);
        if (bVar1) {
          bVar1 = HandleLevel3(this,(cmArgumentList *)local_48,errorString,
                               (MessageType *)
                               newArgs.
                               super__List_base<cmExpandedCommandArgument,_std::allocator<cmExpandedCommandArgument>_>
                               ._M_impl._M_node._M_size);
          if (bVar1) {
            bVar1 = HandleLevel4(this,(cmArgumentList *)local_48,errorString,
                                 (MessageType *)
                                 newArgs.
                                 super__List_base<cmExpandedCommandArgument,_std::allocator<cmExpandedCommandArgument>_>
                                 ._M_impl._M_node._M_size);
            if (bVar1) {
              sVar2 = std::__cxx11::
                      list<cmExpandedCommandArgument,_std::allocator<cmExpandedCommandArgument>_>::
                      size((list<cmExpandedCommandArgument,_std::allocator<cmExpandedCommandArgument>_>
                            *)local_48);
              if (sVar2 == 1) {
                newArg = std::__cxx11::
                         list<cmExpandedCommandArgument,_std::allocator<cmExpandedCommandArgument>_>
                         ::front((list<cmExpandedCommandArgument,_std::allocator<cmExpandedCommandArgument>_>
                                  *)local_48);
                this_local._7_1_ =
                     GetBooleanValueWithAutoDereference
                               (this,newArg,errorString,
                                (MessageType *)
                                newArgs.
                                super__List_base<cmExpandedCommandArgument,_std::allocator<cmExpandedCommandArgument>_>
                                ._M_impl._M_node._M_size,true);
              }
              else {
                std::__cxx11::string::operator=((string *)errorString,"Unknown arguments specified")
                ;
                *(undefined4 *)
                 newArgs.
                 super__List_base<cmExpandedCommandArgument,_std::allocator<cmExpandedCommandArgument>_>
                 ._M_impl._M_node._M_size = 2;
                this_local._7_1_ = false;
              }
            }
            else {
              this_local._7_1_ = false;
            }
          }
          else {
            this_local._7_1_ = false;
          }
        }
        else {
          this_local._7_1_ = false;
        }
      }
      else {
        this_local._7_1_ = false;
      }
    }
    else {
      this_local._7_1_ = false;
    }
    std::__cxx11::list<cmExpandedCommandArgument,_std::allocator<cmExpandedCommandArgument>_>::~list
              ((list<cmExpandedCommandArgument,_std::allocator<cmExpandedCommandArgument>_> *)
               local_48);
  }
  return this_local._7_1_;
}

Assistant:

bool cmConditionEvaluator::IsTrue(
  const std::vector<cmExpandedCommandArgument>& args, std::string& errorString,
  MessageType& status)
{
  errorString.clear();

  // handle empty invocation
  if (args.empty()) {
    return false;
  }

  // store the reduced args in this vector
  cmArgumentList newArgs(args.begin(), args.end());

  // now loop through the arguments and see if we can reduce any of them
  // we do this multiple times. Once for each level of precedence
  // parens
  if (!this->HandleLevel0(newArgs, errorString, status)) {
    return false;
  }
  // predicates
  if (!this->HandleLevel1(newArgs, errorString, status)) {
    return false;
  }
  // binary ops
  if (!this->HandleLevel2(newArgs, errorString, status)) {
    return false;
  }

  // NOT
  if (!this->HandleLevel3(newArgs, errorString, status)) {
    return false;
  }
  // AND OR
  if (!this->HandleLevel4(newArgs, errorString, status)) {
    return false;
  }

  // now at the end there should only be one argument left
  if (newArgs.size() != 1) {
    errorString = "Unknown arguments specified";
    status = MessageType::FATAL_ERROR;
    return false;
  }

  return this->GetBooleanValueWithAutoDereference(newArgs.front(), errorString,
                                                  status, true);
}